

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O0

bool __thiscall sf::priv::RenderTextureImplFBO::activate(RenderTextureImplFBO *this,bool active)

{
  bool bVar1;
  void *pvVar2;
  ostream *poVar3;
  pointer ppVar4;
  byte in_SIL;
  long in_RDI;
  iterator iter;
  Lock lock;
  RenderTextureImplFBO *in_stack_00000068;
  Uint64 contextId;
  map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
  *in_stack_ffffffffffffff68;
  PFNGLBINDFRAMEBUFFEREXTPROC p_Var5;
  iterator in_stack_ffffffffffffff70;
  Mutex *in_stack_ffffffffffffff78;
  Context *in_stack_ffffffffffffff80;
  _Self local_68;
  _Base_ptr local_60;
  int local_54;
  _Self local_50;
  _Base_ptr local_48;
  _Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_> local_40 [4];
  Uint64 local_20;
  byte local_11;
  byte local_1;
  
  local_11 = in_SIL & 1;
  if (local_11 == 0) {
    (*sf_glad_glBindFramebufferEXT)(0x8d40,0);
    local_1 = 1;
    goto LAB_0020a24e;
  }
  local_20 = Context::getActiveContextId();
  if (local_20 == 0) {
    if (*(long *)(in_RDI + 0x78) == 0) {
      pvVar2 = operator_new(8);
      Context::Context(in_stack_ffffffffffffff80);
      *(void **)(in_RDI + 0x78) = pvVar2;
    }
    Context::setActive(in_stack_ffffffffffffff80,SUB81((ulong)in_stack_ffffffffffffff78 >> 0x38,0));
    local_20 = Context::getActiveContextId();
    if (local_20 == 0) {
      poVar3 = err();
      poVar3 = std::operator<<(poVar3,
                               "Impossible to activate render texture (failed to create backup context)"
                              );
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_1 = 0;
      goto LAB_0020a24e;
    }
  }
  Lock::Lock((Lock *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::_Rb_tree_iterator
            (local_40);
  if ((*(byte *)(in_RDI + 0x84) & 1) == 0) {
    in_stack_ffffffffffffff70 =
         std::
         map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
         ::find(in_stack_ffffffffffffff68,(key_type_conflict2 *)0x20a19b);
    local_60 = in_stack_ffffffffffffff70._M_node;
    local_40[0]._M_node = in_stack_ffffffffffffff70._M_node;
    local_68._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
         ::end(in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(local_40,&local_68);
    if (!bVar1) goto LAB_0020a21d;
    p_Var5 = sf_glad_glBindFramebufferEXT;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_> *)
                        0x20a1f6);
    (*p_Var5)(0x8d40,ppVar4->second);
    local_1 = 1;
    local_54 = 1;
  }
  else {
    local_48 = (_Base_ptr)
               std::
               map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
               ::find(in_stack_ffffffffffffff68,(key_type_conflict2 *)0x20a0e1);
    local_40[0]._M_node = local_48;
    local_50._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
         ::end(in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(local_40,&local_50);
    if (bVar1) {
      p_Var5 = sf_glad_glBindFramebufferEXT;
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::
               operator->((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_> *)
                          0x20a13d);
      (*p_Var5)(0x8d40,ppVar4->second);
      local_1 = 1;
      local_54 = 1;
    }
    else {
LAB_0020a21d:
      local_54 = 0;
    }
  }
  Lock::~Lock((Lock *)in_stack_ffffffffffffff70._M_node);
  if (local_54 == 0) {
    local_1 = createFrameBuffer(in_stack_00000068);
  }
LAB_0020a24e:
  return (bool)(local_1 & 1);
}

Assistant:

bool RenderTextureImplFBO::activate(bool active)
{
    // Unbind the FBO if requested
    if (!active)
    {
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, 0));
        return true;
    }

    Uint64 contextId = Context::getActiveContextId();

    // In the odd case we have to activate and there is no active
    // context yet, we have to create one
    if (!contextId)
    {
        if (!m_context)
            m_context = new Context;

        m_context->setActive(true);

        contextId = Context::getActiveContextId();

        if (!contextId)
        {
            err() << "Impossible to activate render texture (failed to create backup context)" << std::endl;

            return false;
        }
    }

    // Lookup the FBO corresponding to the currently active context
    // If none is found, there is no FBO corresponding to the
    // currently active context so we will have to create a new FBO
    {
        Lock lock(mutex);

        std::map<Uint64, unsigned int>::iterator iter;
        
        if (m_multisample)
        {
            iter = m_multisampleFrameBuffers.find(contextId);

            if (iter != m_multisampleFrameBuffers.end())
            {
                glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, iter->second));

                return true;
            }
        }
        else
        {
            iter = m_frameBuffers.find(contextId);

            if (iter != m_frameBuffers.end())
            {
                glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, iter->second));

                return true;
            }
        }
    }

    return createFrameBuffer();
}